

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

NetSymbol *
slang::ast::NetSymbol::createImplicit
          (Compilation *compilation,IdentifierNameSyntax *syntax,NetType *netType)

{
  NetSymbol *this;
  NetType *args_2;
  SyntaxNode *in_RSI;
  Compilation *in_RDI;
  string_view sVar1;
  NetSymbol *net;
  Token t;
  Compilation *type;
  Token *in_stack_ffffffffffffffc0;
  SourceLocation *in_stack_ffffffffffffffd0;
  NetSymbol *this_00;
  basic_string_view<char,_std::char_traits<char>_> *args;
  SyntaxNode *this_01;
  
  args = *(basic_string_view<char,_std::char_traits<char>_> **)(in_RSI + 1);
  this_01 = in_RSI[1].parent;
  type = in_RDI;
  sVar1 = parsing::Token::valueText(in_stack_ffffffffffffffc0);
  args_2 = (NetType *)sVar1._M_str;
  parsing::Token::location((Token *)&stack0xffffffffffffffd8);
  this = BumpAllocator::
         emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                   ((BumpAllocator *)this_01,args,in_stack_ffffffffffffffd0,args_2);
  this_00 = this;
  Compilation::getLogicType(in_RDI);
  ValueSymbol::setType(&this->super_ValueSymbol,(Type *)type);
  this_00->isImplicit = true;
  Symbol::setSyntax((Symbol *)this_00,in_RSI);
  return this_00;
}

Assistant:

NetSymbol& NetSymbol::createImplicit(Compilation& compilation, const IdentifierNameSyntax& syntax,
                                     const NetType& netType) {
    auto t = syntax.identifier;
    auto net = compilation.emplace<NetSymbol>(t.valueText(), t.location(), netType);
    net->setType(compilation.getLogicType());
    net->isImplicit = true;
    net->setSyntax(syntax);
    return *net;
}